

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filefind.cpp
# Opt level: O3

void __thiscall Am_Filename::Am_Filename(Am_Filename *this,Am_Filename *dir,Am_Filename *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  long lVar4;
  long *plVar5;
  size_type *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  sVar2 = (name->filename)._M_string_length;
  if ((sVar2 != 0) && (*(name->filename)._M_dataplus._M_p != '/')) {
    pcVar3 = (dir->filename)._M_dataplus._M_p;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,pcVar3,pcVar3 + (dir->filename)._M_string_length);
    std::__cxx11::string::append((char *)local_40);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_40,(ulong)(name->filename)._M_dataplus._M_p);
    paVar1 = &(this->filename).field_2;
    (this->filename)._M_dataplus._M_p = (pointer)paVar1;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar6) {
      lVar4 = plVar5[3];
      paVar1->_M_allocated_capacity = *psVar6;
      *(long *)((long)&(this->filename).field_2 + 8) = lVar4;
    }
    else {
      (this->filename)._M_dataplus._M_p = (pointer)*plVar5;
      (this->filename).field_2._M_allocated_capacity = *psVar6;
    }
    (this->filename)._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
    return;
  }
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  pcVar3 = (name->filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar3,pcVar3 + sVar2);
  return;
}

Assistant:

Am_Filename::Am_Filename(const Am_Filename &dir, const Am_Filename &name)
    : filename(name.Is_Relative() ? dir.filename + "/" + name.filename
                                  : name.filename) // UNIX-specific
{
}